

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O2

int decode(jpeg *j,huffman *h)

{
  uint uVar1;
  uint uVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  ushort uVar8;
  
  iVar4 = j->code_bits;
  if (iVar4 < 0x10) {
    grow_buffer_unsafe(j);
    iVar4 = j->code_bits;
  }
  uVar1 = j->code_buffer;
  uVar7 = (ulong)h->fast[uVar1 >> ((char)iVar4 - 9U & 0x1f) & 0x1ff];
  if (uVar7 == 0xff) {
    bVar3 = 0x10U - (char)iVar4 & 0x1f;
    uVar8 = (ushort)(uVar1 >> ((byte)(iVar4 + -0x10) & 0x1f));
    if (iVar4 < 0x10) {
      uVar8 = (ushort)(uVar1 << bVar3);
    }
    uVar7 = (ulong)(uint)(0 << bVar3);
    do {
      uVar6 = uVar7;
      uVar7 = uVar6 + 1;
    } while (h->maxcode[uVar6 + 10] <= (uint)uVar8);
    if (uVar7 == 8) {
      j->code_bits = iVar4 + -0x10;
    }
    else if ((int)uVar6 + 10 <= iVar4) {
      iVar5 = (iVar4 + -9) - (int)uVar7;
      uVar2 = bmask[uVar6 + 10];
      iVar4 = h->delta[uVar6 + 10];
      j->code_bits = iVar5;
      return (uint)h->values[(int)((uVar1 >> ((byte)iVar5 & 0x1f) & uVar2) + iVar4)];
    }
  }
  else if ((int)(uint)h->size[uVar7] <= iVar4) {
    j->code_bits = iVar4 - (uint)h->size[uVar7];
    return (uint)h->values[uVar7];
  }
  return -1;
}

Assistant:

__forceinline static int decode(jpeg *j, huffman *h)
{
   unsigned int temp;
   int c,k;

   if (j->code_bits < 16) grow_buffer_unsafe(j);

   // look at the top FAST_BITS and determine what symbol ID it is,
   // if the code is <= FAST_BITS
   c = (j->code_buffer >> (j->code_bits - FAST_BITS)) & ((1 << FAST_BITS)-1);
   k = h->fast[c];
   if (k < 255) {
      if (h->size[k] > j->code_bits)
         return -1;
      j->code_bits -= h->size[k];
      return h->values[k];
   }

   // naive test is to shift the code_buffer down so k bits are
   // valid, then test against maxcode. To speed this up, we've
   // preshifted maxcode left so that it has (16-k) 0s at the
   // end; in other words, regardless of the number of bits, it
   // wants to be compared against something shifted to have 16;
   // that way we don't need to shift inside the loop.
   if (j->code_bits < 16)
      temp = (j->code_buffer << (16 - j->code_bits)) & 0xffff;
   else
      temp = (j->code_buffer >> (j->code_bits - 16)) & 0xffff;
   for (k=FAST_BITS+1 ; ; ++k)
      if (temp < h->maxcode[k])
         break;
   if (k == 17) {
      // error! code not found
      j->code_bits -= 16;
      return -1;
   }

   if (k > j->code_bits)
      return -1;

   // convert the huffman code to the symbol id
   c = ((j->code_buffer >> (j->code_bits - k)) & bmask[k]) + h->delta[k];
   assert((((j->code_buffer) >> (j->code_bits - h->size[c])) & bmask[h->size[c]]) == h->code[c]);

   // convert the id to a symbol
   j->code_bits -= k;
   return h->values[c];
}